

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImGuiPlatformMonitor *pIVar1;
  ImGuiViewportP *pIVar2;
  long lVar3;
  ImVec2 *pIVar4;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar12;
  ImRect IVar13;
  ImVec2 IVar11;
  
  lVar3 = (long)window->ViewportAllowPlatformMonitorExtend;
  if (lVar3 < 0) {
    pIVar2 = window->Viewport;
    pIVar4 = &(pIVar2->super_ImGuiViewport).Pos;
    IVar6 = (pIVar2->super_ImGuiViewport).Pos;
    IVar11 = (pIVar2->super_ImGuiViewport).Size;
  }
  else {
    pIVar1 = (GImGui->PlatformIO).Monitors.Data;
    pIVar4 = &pIVar1[lVar3].WorkPos;
    IVar6 = *pIVar4;
    IVar11 = pIVar1[lVar3].WorkSize;
  }
  fVar10 = IVar11.x + IVar6.x;
  fVar12 = IVar11.y + IVar6.y;
  IVar6 = (GImGui->Style).DisplaySafeAreaPadding;
  fVar5 = (*pIVar4).x;
  fVar7 = (*pIVar4).y;
  fVar8 = IVar6.x;
  fVar9 = IVar6.y;
  fVar8 = (float)((uint)-fVar8 & -(uint)(fVar8 + fVar8 < fVar10 - fVar5));
  fVar9 = (float)((uint)-fVar9 & -(uint)(fVar9 + fVar9 < fVar12 - fVar7));
  IVar13.Min.x = fVar5 - fVar8;
  IVar13.Min.y = fVar7 - fVar9;
  IVar13.Max.x = fVar8 + fVar10;
  IVar13.Max.y = fVar9 + fVar12;
  return IVar13;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        r_screen.Min = window->Viewport->Pos;
        r_screen.Max = window->Viewport->Pos + window->Viewport->Size;
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}